

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O0

size_t __thiscall
Assimp::BlobIOStream::Write(BlobIOStream *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  size_t __n;
  unsigned_long *puVar1;
  size_t pCount_local;
  size_t pSize_local;
  void *pvBuffer_local;
  BlobIOStream *this_local;
  
  __n = pCount * pSize;
  if (this->cur_size < this->cursor + __n) {
    Grow(this,this->cursor + __n);
  }
  memcpy(this->buffer + this->cursor,pvBuffer,__n);
  this->cursor = __n + this->cursor;
  puVar1 = std::max<unsigned_long>(&this->file_size,&this->cursor);
  this->file_size = *puVar1;
  return pCount;
}

Assistant:

virtual size_t Write(const void* pvBuffer,
        size_t pSize,
        size_t pCount)
    {
        pSize *= pCount;
        if (cursor + pSize > cur_size) {
            Grow(cursor + pSize);
        }

        memcpy(buffer+cursor, pvBuffer, pSize);
        cursor += pSize;

        file_size = std::max(file_size,cursor);
        return pCount;
    }